

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::RenderPassCreateInfo::RenderPassCreateInfo
          (RenderPassCreateInfo *this,deUint32 _attachmentCount,
          VkAttachmentDescription *_pAttachments,deUint32 _subpassCount,
          VkSubpassDescription *_pSubpasses,deUint32 _dependencyCount,
          VkSubpassDependency *_pDependiences)

{
  VkAttachmentDescription *__last;
  VkSubpassDescription *__last_00;
  VkSubpassDescription *__first;
  VkAttachmentDescription *__first_00;
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  ulong uVar5;
  allocator<vk::VkSubpassDependency> local_131;
  __normal_iterator<vkt::Draw::SubpassDependency_*,_std::vector<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>_>
  local_130;
  __normal_iterator<vkt::Draw::SubpassDependency_*,_std::vector<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>_>
  local_128;
  vector<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_> local_120;
  allocator<vk::VkSubpassDescription> local_101;
  __normal_iterator<vkt::Draw::SubpassDescription_*,_std::vector<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>_>
  local_100;
  __normal_iterator<vkt::Draw::SubpassDescription_*,_std::vector<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>_>
  local_f8;
  vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> local_f0;
  allocator<vk::VkAttachmentDescription> local_d1;
  __normal_iterator<vkt::Draw::AttachmentDescription_*,_std::vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>_>
  local_d0;
  __normal_iterator<vkt::Draw::AttachmentDescription_*,_std::vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>_>
  local_c8;
  vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_> local_c0;
  allocator<vkt::Draw::SubpassDependency> local_a1;
  vector<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_> local_a0;
  allocator<vkt::Draw::SubpassDescription> local_81;
  vector<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_> local_80;
  allocator<vkt::Draw::AttachmentDescription> local_51;
  vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
  local_50;
  deUint32 local_34;
  VkSubpassDescription *pVStack_30;
  deUint32 _dependencyCount_local;
  VkSubpassDescription *_pSubpasses_local;
  VkAttachmentDescription *pVStack_20;
  deUint32 _subpassCount_local;
  VkAttachmentDescription *_pAttachments_local;
  RenderPassCreateInfo *pRStack_10;
  deUint32 _attachmentCount_local;
  RenderPassCreateInfo *this_local;
  
  local_34 = _dependencyCount;
  pVStack_30 = _pSubpasses;
  _pSubpasses_local._4_4_ = _subpassCount;
  pVStack_20 = _pAttachments;
  _pAttachments_local._4_4_ = _attachmentCount;
  pRStack_10 = this;
  std::vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>::
  vector(&this->m_attachments);
  std::vector<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>::vector
            (&this->m_subpasses);
  std::vector<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>::vector
            (&this->m_dependiences);
  std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::vector
            (&this->m_attachmentsStructs);
  std::vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>::vector
            (&this->m_subpassesStructs);
  std::vector<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>::vector
            (&this->m_dependiencesStructs);
  __first_00 = pVStack_20;
  __last = pVStack_20 + _pAttachments_local._4_4_;
  std::allocator<vkt::Draw::AttachmentDescription>::allocator(&local_51);
  std::vector<vkt::Draw::AttachmentDescription,std::allocator<vkt::Draw::AttachmentDescription>>::
  vector<vk::VkAttachmentDescription_const*,void>
            ((vector<vkt::Draw::AttachmentDescription,std::allocator<vkt::Draw::AttachmentDescription>>
              *)&local_50,__first_00,__last,&local_51);
  std::vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>::
  operator=(&this->m_attachments,&local_50);
  std::vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>::
  ~vector(&local_50);
  std::allocator<vkt::Draw::AttachmentDescription>::~allocator(&local_51);
  __first = pVStack_30;
  __last_00 = pVStack_30 + _pSubpasses_local._4_4_;
  std::allocator<vkt::Draw::SubpassDescription>::allocator(&local_81);
  std::vector<vkt::Draw::SubpassDescription,std::allocator<vkt::Draw::SubpassDescription>>::
  vector<vk::VkSubpassDescription_const*,void>
            ((vector<vkt::Draw::SubpassDescription,std::allocator<vkt::Draw::SubpassDescription>> *)
             &local_80,__first,__last_00,&local_81);
  std::vector<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>::
  operator=(&this->m_subpasses,&local_80);
  std::vector<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>::
  ~vector(&local_80);
  std::allocator<vkt::Draw::SubpassDescription>::~allocator(&local_81);
  uVar5 = (ulong)local_34;
  std::allocator<vkt::Draw::SubpassDependency>::allocator(&local_a1);
  std::vector<vkt::Draw::SubpassDependency,std::allocator<vkt::Draw::SubpassDependency>>::
  vector<vk::VkSubpassDependency_const*,void>
            ((vector<vkt::Draw::SubpassDependency,std::allocator<vkt::Draw::SubpassDependency>> *)
             &local_a0,_pDependiences,_pDependiences + uVar5,&local_a1);
  std::vector<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>::
  operator=(&this->m_dependiences,&local_a0);
  std::vector<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>::~vector
            (&local_a0);
  std::allocator<vkt::Draw::SubpassDependency>::~allocator(&local_a1);
  local_c8._M_current =
       (AttachmentDescription *)
       std::
       vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>::
       begin(&this->m_attachments);
  local_d0._M_current =
       (AttachmentDescription *)
       std::
       vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>::
       end(&this->m_attachments);
  std::allocator<vk::VkAttachmentDescription>::allocator(&local_d1);
  std::vector<vk::VkAttachmentDescription,std::allocator<vk::VkAttachmentDescription>>::
  vector<__gnu_cxx::__normal_iterator<vkt::Draw::AttachmentDescription*,std::vector<vkt::Draw::AttachmentDescription,std::allocator<vkt::Draw::AttachmentDescription>>>,void>
            ((vector<vk::VkAttachmentDescription,std::allocator<vk::VkAttachmentDescription>> *)
             &local_c0,local_c8,local_d0,&local_d1);
  std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::operator=
            (&this->m_attachmentsStructs,&local_c0);
  std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::~vector
            (&local_c0);
  std::allocator<vk::VkAttachmentDescription>::~allocator(&local_d1);
  local_f8._M_current =
       (SubpassDescription *)
       std::vector<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>::
       begin(&this->m_subpasses);
  local_100._M_current =
       (SubpassDescription *)
       std::vector<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>::
       end(&this->m_subpasses);
  std::allocator<vk::VkSubpassDescription>::allocator(&local_101);
  std::vector<vk::VkSubpassDescription,std::allocator<vk::VkSubpassDescription>>::
  vector<__gnu_cxx::__normal_iterator<vkt::Draw::SubpassDescription*,std::vector<vkt::Draw::SubpassDescription,std::allocator<vkt::Draw::SubpassDescription>>>,void>
            ((vector<vk::VkSubpassDescription,std::allocator<vk::VkSubpassDescription>> *)&local_f0,
             local_f8,local_100,&local_101);
  std::vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>::operator=
            (&this->m_subpassesStructs,&local_f0);
  std::vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>::~vector
            (&local_f0);
  std::allocator<vk::VkSubpassDescription>::~allocator(&local_101);
  local_128._M_current =
       (SubpassDependency *)
       std::vector<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>::
       begin(&this->m_dependiences);
  local_130._M_current =
       (SubpassDependency *)
       std::vector<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>::end
                 (&this->m_dependiences);
  std::allocator<vk::VkSubpassDependency>::allocator(&local_131);
  std::vector<vk::VkSubpassDependency,std::allocator<vk::VkSubpassDependency>>::
  vector<__gnu_cxx::__normal_iterator<vkt::Draw::SubpassDependency*,std::vector<vkt::Draw::SubpassDependency,std::allocator<vkt::Draw::SubpassDependency>>>,void>
            ((vector<vk::VkSubpassDependency,std::allocator<vk::VkSubpassDependency>> *)&local_120,
             local_128,local_130,&local_131);
  std::vector<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>::operator=
            (&this->m_dependiencesStructs,&local_120);
  std::vector<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>::~vector
            (&local_120);
  std::allocator<vk::VkSubpassDependency>::~allocator(&local_131);
  (this->super_VkRenderPassCreateInfo).sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  (this->super_VkRenderPassCreateInfo).pNext = (void *)0x0;
  (this->super_VkRenderPassCreateInfo).flags = 0;
  sVar1 = std::
          vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
          ::size(&this->m_attachments);
  (this->super_VkRenderPassCreateInfo).attachmentCount = (deUint32)sVar1;
  if ((this->super_VkRenderPassCreateInfo).attachmentCount == 0) {
    (this->super_VkRenderPassCreateInfo).pAttachments = (VkAttachmentDescription *)0x0;
  }
  else {
    pvVar2 = std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
             ::operator[](&this->m_attachmentsStructs,0);
    (this->super_VkRenderPassCreateInfo).pAttachments = pvVar2;
  }
  sVar1 = std::vector<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
          ::size(&this->m_subpasses);
  (this->super_VkRenderPassCreateInfo).subpassCount = (deUint32)sVar1;
  if ((this->super_VkRenderPassCreateInfo).subpassCount == 0) {
    (this->super_VkRenderPassCreateInfo).pSubpasses = (VkSubpassDescription *)0x0;
  }
  else {
    pvVar3 = std::vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>::
             operator[](&this->m_subpassesStructs,0);
    (this->super_VkRenderPassCreateInfo).pSubpasses = pvVar3;
  }
  sVar1 = std::vector<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>::
          size(&this->m_dependiences);
  (this->super_VkRenderPassCreateInfo).dependencyCount = (deUint32)sVar1;
  if ((this->super_VkRenderPassCreateInfo).dependencyCount == 0) {
    (this->super_VkRenderPassCreateInfo).pDependencies = (VkSubpassDependency *)0x0;
  }
  else {
    pvVar4 = std::vector<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>::
             operator[](&this->m_dependiencesStructs,0);
    (this->super_VkRenderPassCreateInfo).pDependencies = pvVar4;
  }
  return;
}

Assistant:

RenderPassCreateInfo::RenderPassCreateInfo (deUint32							_attachmentCount,
											const vk::VkAttachmentDescription*	_pAttachments,
											deUint32							_subpassCount,
											const vk::VkSubpassDescription*		_pSubpasses,
											deUint32							_dependencyCount,
											const vk::VkSubpassDependency*		_pDependiences)
{

	m_attachments	= std::vector<AttachmentDescription>(_pAttachments, _pAttachments + _attachmentCount);
	m_subpasses		= std::vector<SubpassDescription>(_pSubpasses, _pSubpasses + _subpassCount);
	m_dependiences	= std::vector<SubpassDependency>(_pDependiences, _pDependiences + _dependencyCount);

	m_attachmentsStructs	= std::vector<vk::VkAttachmentDescription>	(m_attachments.begin(),		m_attachments.end());
	m_subpassesStructs		= std::vector<vk::VkSubpassDescription>		(m_subpasses.begin(),		m_subpasses.end());
	m_dependiencesStructs	= std::vector<vk::VkSubpassDependency>		(m_dependiences.begin(),	m_dependiences.end());

	sType = vk::VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
	pNext = DE_NULL;
	flags = 0;

	attachmentCount = static_cast<deUint32>(m_attachments.size());

	if (attachmentCount) {
		pAttachments = &m_attachmentsStructs[0];
	}
	else
	{
		pAttachments = DE_NULL;
	}

	subpassCount = static_cast<deUint32>(m_subpasses.size());

	if (subpassCount) {
		pSubpasses = &m_subpassesStructs[0];
	}
	else
	{
		pSubpasses = DE_NULL;
	}

	dependencyCount = static_cast<deUint32>(m_dependiences.size());

	if (dependencyCount) {
		pDependencies = &m_dependiencesStructs[0];
	}
	else
	{
		pDependencies = DE_NULL;
	}
}